

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O3

void __thiscall rtosc::UndoHistory::seekHistory(UndoHistory *this,int distance)

{
  UndoHistoryImpl *pUVar1;
  _Map_pointer pppVar2;
  ulong uVar3;
  _Elt_pointer ppVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  pUVar1 = this->impl;
  lVar6 = pUVar1->history_pos + (long)distance;
  iVar7 = (int)pUVar1->history_pos;
  if (lVar6 < 0) {
    distance = -iVar7;
  }
  pppVar2 = (pUVar1->history).
            super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar8 = ((long)(pUVar1->history).
                 super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(pUVar1->history).
                 super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
          ((long)(pUVar1->history).
                 super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)(pUVar1->history).
                 super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
          ((((ulong)((long)pppVar2 -
                    (long)(pUVar1->history).
                          super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(pppVar2 == (_Map_pointer)0x0)) * 0x20;
  iVar7 = (int)lVar8 - iVar7;
  if (lVar6 <= lVar8) {
    iVar7 = distance;
  }
  if (iVar7 != 0) {
    if (iVar7 < 0) {
      do {
        pUVar1 = this->impl;
        lVar6 = pUVar1->history_pos + -1;
        pUVar1->history_pos = lVar6;
        ppVar4 = (pUVar1->history).
                 super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar3 = ((long)ppVar4 -
                 (long)(pUVar1->history).
                       super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + lVar6;
        if ((long)uVar3 < 0) {
          uVar5 = (long)uVar3 >> 5;
LAB_001116cd:
          ppVar4 = (pUVar1->history).
                   super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] + uVar3 + uVar5 * -0x20;
        }
        else {
          if (0x1f < uVar3) {
            uVar5 = uVar3 >> 5;
            goto LAB_001116cd;
          }
          ppVar4 = ppVar4 + lVar6;
        }
        iVar7 = iVar7 + 1;
        UndoHistoryImpl::rewind(pUVar1,(FILE *)ppVar4->second);
      } while (iVar7 != 0);
    }
    else {
      do {
        pUVar1 = this->impl;
        lVar6 = pUVar1->history_pos;
        pUVar1->history_pos = lVar6 + 1;
        ppVar4 = (pUVar1->history).
                 super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar3 = ((long)ppVar4 -
                 (long)(pUVar1->history).
                       super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + lVar6;
        if ((long)uVar3 < 0) {
          uVar5 = (long)uVar3 >> 5;
LAB_00111662:
          ppVar4 = (pUVar1->history).
                   super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] + uVar3 + uVar5 * -0x20;
        }
        else {
          if (0x1f < uVar3) {
            uVar5 = uVar3 >> 5;
            goto LAB_00111662;
          }
          ppVar4 = ppVar4 + lVar6;
        }
        iVar7 = iVar7 + -1;
        UndoHistoryImpl::replay(pUVar1,ppVar4->second);
      } while (iVar7 != 0);
    }
  }
  return;
}

Assistant:

void UndoHistory::seekHistory(int distance)
{
    //TODO print out the events that would need to take place to get to the
    //final destination
    
    //TODO limit the distance to be to applicable sizes
    //ie ones that do not exceed the known history/future
    long dest = impl->history_pos + distance;
    if(dest < 0)
        distance -= dest;
    if(dest > (long) impl->history.size())
        distance  = impl->history.size() - impl->history_pos;
    if(!distance)
        return;
    
    //TODO account for traveling back in time
    if(distance<0)
        while(distance++)
            impl->rewind(impl->history[--impl->history_pos].second);
    else
        while(distance--)
            impl->replay(impl->history[impl->history_pos++].second);
}